

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_timer.c
# Opt level: O2

void test_arming_settime_fails(void)

{
  cio_error cVar1;
  cio_timer timer;
  
  timerfd_create_fake.return_val = 5;
  timerfd_settime_fake.custom_fake = settime_fails;
  read_fake.custom_fake = read_blocks;
  cVar1 = cio_timer_init(&timer,(cio_eventloop *)0x0,(cio_timer_close_hook_t)0x0);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x148,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_timer_expires_from_now(&timer,2000,handle_timeout,(void *)0x0);
  if (cVar1 != CIO_SUCCESS) {
    UnityAssertEqualNumber
              (0,(ulong)handle_timeout_fake.call_count,
               "Timer callback was called even if arming failed!",0x14c,UNITY_DISPLAY_STYLE_INT);
    return;
  }
  UnityFail("Timer arming did not fail when settime fails!",0x14b);
}

Assistant:

static void test_arming_settime_fails(void)
{
	static const int timerfd = 5;
	timerfd_create_fake.return_val = timerfd;
	timerfd_settime_fake.custom_fake = settime_fails;
	read_fake.custom_fake = read_blocks;

	struct cio_timer timer;
	enum cio_error err = cio_timer_init(&timer, NULL, NULL);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);

	err = cio_timer_expires_from_now(&timer, 2000, handle_timeout, NULL);
	TEST_ASSERT_MESSAGE(err != CIO_SUCCESS, "Timer arming did not fail when settime fails!");
	TEST_ASSERT_EQUAL_MESSAGE(0, handle_timeout_fake.call_count, "Timer callback was called even if arming failed!");
}